

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSizeAllocationsManager.hpp
# Opt level: O1

Allocation __thiscall
Diligent::VariableSizeAllocationsManager::Allocate
          (VariableSizeAllocationsManager *this,OffsetType Size,OffsetType Alignment)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  char *pcVar3;
  VariableSizeAllocationsManager *this_00;
  char *pcVar4;
  char (*in_RCX) [9];
  char (*Args_1) [57];
  char *pcVar5;
  ulong uVar6;
  char (*in_R8) [23];
  char (*pacVar7) [59];
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  const_iterator __position;
  Allocation AVar11;
  string msg;
  string local_78;
  char *local_58;
  char *local_50;
  const_iterator local_48;
  char (*local_40) [59];
  VariableSizeAllocationsManager *local_38;
  long lVar10;
  
  local_58 = (char *)Alignment;
  if (Size == 0) {
    FormatString<char[26],char[9]>
              (&local_78,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x778f78,in_RCX);
    DebugAssertionFailed
              (local_78._M_dataplus._M_p,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0xd0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  if ((char *)((ulong)local_58 ^ (ulong)(local_58 + -1)) <= local_58 + -1) {
    FormatString<char[12],unsigned_long,char[21]>
              (&local_78,(Diligent *)"Alignment (",(char (*) [12])&local_58,
               (unsigned_long *)") must be power of 2",(char (*) [21])in_R8);
    DebugAssertionFailed
              (local_78._M_dataplus._M_p,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0xd1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  local_50 = local_58;
  if ((char *)((ulong)local_58 ^ (ulong)(local_58 + -1)) <= local_58 + -1) {
    FormatString<char[12],unsigned_long,char[23]>
              (&local_78,(Diligent *)"Alignment (",(char (*) [12])&local_50,
               (unsigned_long *)") must be a power of 2",in_R8);
    DebugAssertionFailed
              (local_78._M_dataplus._M_p,"AlignUp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
               ,0x34);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar5 = (char *)(-(long)local_50 & (ulong)(local_50 + (Size - 1)));
  pacVar7 = (char (*) [59])0xffffffffffffffff;
  if (pcVar5 <= (char *)this->m_FreeSize) {
    lVar10 = 0;
    if ((char *)this->m_CurrAlignment <= local_58) {
      lVar10 = (long)local_58 - this->m_CurrAlignment;
    }
    p_Var9 = (_Base_ptr)(pcVar5 + lVar10);
    p_Var1 = &(this->m_FreeBlocksBySize)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = (this->m_FreeBlocksBySize)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    __position._M_node = &p_Var1->_M_header;
    for (; p_Var2 != (_Base_ptr)0x0;
        p_Var2 = (&p_Var2->_M_left)[*(_Base_ptr *)(p_Var2 + 1) < p_Var9]) {
      if (*(_Base_ptr *)(p_Var2 + 1) >= p_Var9) {
        __position._M_node = p_Var2;
      }
    }
    if ((_Rb_tree_header *)__position._M_node != p_Var1) {
      p_Var8 = __position._M_node[1]._M_parent;
      Args_1 = (char (*) [57])0x0;
      if (p_Var8[1]._M_parent < p_Var9) {
        FormatString<char[26],char[56]>
                  (&local_78,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"Size + AlignmentReserve <= SmallestBlockIt->second.Size",
                   (char (*) [56])0x0);
        Args_1 = (char (*) [57])0xdf;
        DebugAssertionFailed
                  (local_78._M_dataplus._M_p,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                   ,0xdf);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
      if (p_Var8[1]._M_parent != *(_Base_ptr *)(__position._M_node + 1)) {
        FormatString<char[26],char[57]>
                  (&local_78,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"SmallestBlockIt->second.Size == SmallestBlockItIt->first",Args_1)
        ;
        Args_1 = (char (*) [57])0xe0;
        DebugAssertionFailed
                  (local_78._M_dataplus._M_p,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                   ,0xe0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
      pacVar7 = *(char (**) [59])(p_Var8 + 1);
      local_48._M_node = p_Var8;
      if ((ulong)pacVar7 % this->m_CurrAlignment != 0) {
        FormatString<char[26],char[30]>
                  (&local_78,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"Offset % m_CurrAlignment == 0",(char (*) [30])Args_1);
        DebugAssertionFailed
                  (local_78._M_dataplus._M_p,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                   ,0xea);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
      local_50 = local_58;
      local_40 = pacVar7;
      if ((char *)((ulong)local_58 ^ (ulong)(local_58 + -1)) <= local_58 + -1) {
        FormatString<char[12],unsigned_long,char[23]>
                  (&local_78,(Diligent *)"Alignment (",(char (*) [12])&local_50,
                   (unsigned_long *)") must be a power of 2",in_R8);
        DebugAssertionFailed
                  (local_78._M_dataplus._M_p,"AlignUp",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
                   ,0x34);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar4 = local_50 + (long)*local_40 + -1;
      uVar6 = -(long)local_50;
      p_Var8 = (_Base_ptr)(pcVar5 + ((uVar6 & (ulong)pcVar4) - (long)local_40));
      pacVar7 = local_40;
      local_38 = this;
      if (p_Var9 < p_Var8) {
        FormatString<char[26],char[40]>
                  (&local_78,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"AdjustedSize <= Size + AlignmentReserve",(char (*) [40])local_40)
        ;
        pacVar7 = (char (*) [59])0xed;
        DebugAssertionFailed
                  (local_78._M_dataplus._M_p,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                   ,0xed);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
      p_Var9 = local_48._M_node[1]._M_parent;
      if (__position._M_node != local_48._M_node[1]._M_left) {
        FormatString<char[26],char[59]>
                  (&local_78,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"SmallestBlockItIt == SmallestBlockIt->second.OrderBySizeIt",
                   pacVar7);
        DebugAssertionFailed
                  (local_78._M_dataplus._M_p,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                   ,0xf0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
      this_00 = local_38;
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>_>
      ::_M_erase_aux(&(local_38->m_FreeBlocksBySize)._M_t,__position);
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_std::_Select1st<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
      ::_M_erase_aux((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_std::_Select1st<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
                      *)this_00,local_48);
      if (p_Var9 != p_Var8) {
        AddNewBlock(this_00,(OffsetType)(pcVar5 + (uVar6 & (ulong)pcVar4)),
                    (long)p_Var9 - (long)p_Var8);
      }
      pacVar7 = local_40;
      this_00->m_FreeSize = this_00->m_FreeSize - (long)p_Var8;
      pcVar3 = (char *)this_00->m_CurrAlignment;
      pcVar4 = pcVar3 + -1;
      if (((ulong)pcVar4 & (ulong)pcVar5) != 0) {
        if (pcVar5 + -1 < (char *)((ulong)pcVar5 ^ (ulong)(pcVar5 + -1))) {
          pcVar4 = (char *)CONCAT71((int7)((ulong)local_58 >> 8),local_58 <= pcVar5);
          if (pcVar3 <= pcVar5 || local_58 > pcVar5) {
            FormatString<char[26],char[44]>
                      (&local_78,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"Size >= Alignment && Size < m_CurrAlignment",
                       (char (*) [44])pcVar4);
            pcVar4 = (char *)0xfe;
            DebugAssertionFailed
                      (local_78._M_dataplus._M_p,"Allocate",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                       ,0xfe);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
          }
        }
        else {
          pcVar4 = local_58;
          pcVar5 = local_58;
          if (pcVar3 <= local_58) {
            pcVar4 = (char *)this_00->m_CurrAlignment;
            pcVar5 = pcVar4;
          }
        }
        this_00->m_CurrAlignment = (OffsetType)pcVar5;
      }
      if ((this_00->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header._M_node_count !=
          (this_00->m_FreeBlocksBySize)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        FormatString<char[26],char[57]>
                  (&local_78,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"m_FreeBlocksByOffset.size() == m_FreeBlocksBySize.size()",
                   (char (*) [57])pcVar4);
        DebugAssertionFailed
                  (local_78._M_dataplus._M_p,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                   ,0x108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
      if (this_00->m_DbgDisableDebugValidation == false) {
        DbgVerifyList(this_00);
      }
      goto LAB_002744a5;
    }
  }
  p_Var8 = (_Base_ptr)0x0;
LAB_002744a5:
  AVar11.Size = (OffsetType)p_Var8;
  AVar11.UnalignedOffset = (OffsetType)pacVar7;
  return AVar11;
}

Assistant:

Allocation Allocate(OffsetType Size, OffsetType Alignment)
    {
        VERIFY_EXPR(Size > 0);
        VERIFY(IsPowerOfTwo(Alignment), "Alignment (", Alignment, ") must be power of 2");
        Size = AlignUp(Size, Alignment);
        if (m_FreeSize < Size)
            return Allocation::InvalidAllocation();

        OffsetType AlignmentReserve = (Alignment > m_CurrAlignment) ? Alignment - m_CurrAlignment : 0;
        // Get the first block that is large enough to encompass Size + AlignmentReserve bytes
        // lower_bound() returns an iterator pointing to the first element that
        // is not less (i.e. >= ) than key
        auto SmallestBlockItIt = m_FreeBlocksBySize.lower_bound(Size + AlignmentReserve);
        if (SmallestBlockItIt == m_FreeBlocksBySize.end())
            return Allocation::InvalidAllocation();

        auto SmallestBlockIt = SmallestBlockItIt->second;
        VERIFY_EXPR(Size + AlignmentReserve <= SmallestBlockIt->second.Size);
        VERIFY_EXPR(SmallestBlockIt->second.Size == SmallestBlockItIt->first);

        //     SmallestBlockIt.Offset
        //        |                                  |
        //        |<------SmallestBlockIt.Size------>|
        //        |<------Size------>|<---NewSize--->|
        //        |                  |
        //      Offset              NewOffset
        //
        OffsetType Offset = SmallestBlockIt->first;
        VERIFY_EXPR(Offset % m_CurrAlignment == 0);
        OffsetType AlignedOffset = AlignUp(Offset, Alignment);
        OffsetType AdjustedSize  = Size + (AlignedOffset - Offset);
        VERIFY_EXPR(AdjustedSize <= Size + AlignmentReserve);
        OffsetType NewOffset = Offset + AdjustedSize;
        OffsetType NewSize   = SmallestBlockIt->second.Size - AdjustedSize;
        VERIFY_EXPR(SmallestBlockItIt == SmallestBlockIt->second.OrderBySizeIt);
        m_FreeBlocksBySize.erase(SmallestBlockItIt);
        m_FreeBlocksByOffset.erase(SmallestBlockIt);
        if (NewSize > 0)
        {
            AddNewBlock(NewOffset, NewSize);
        }

        m_FreeSize -= AdjustedSize;

        if ((Size & (m_CurrAlignment - 1)) != 0)
        {
            if (IsPowerOfTwo(Size))
            {
                VERIFY_EXPR(Size >= Alignment && Size < m_CurrAlignment);
                m_CurrAlignment = Size;
            }
            else
            {
                m_CurrAlignment = (std::min)(m_CurrAlignment, Alignment);
            }
        }

#ifdef DILIGENT_DEBUG
        VERIFY_EXPR(m_FreeBlocksByOffset.size() == m_FreeBlocksBySize.size());
        if (!m_DbgDisableDebugValidation)
            DbgVerifyList();
#endif
        return Allocation{Offset, AdjustedSize};
    }